

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O3

void Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::CalculateHitGroupIndex
               (InstanceDesc *Desc,Uint32 *InstanceOffset,Uint32 HitGroupStride,
               HIT_GROUP_BINDING_MODE BindingMode)

{
  uint uVar1;
  string msg;
  Uint32 MaxIndex;
  string local_38;
  char local_14 [4];
  
  uVar1 = Desc->ContributionToHitGroupIndex;
  if (uVar1 != 0xffffffff) {
    if (BindingMode == HIT_GROUP_BINDING_MODE_LAST) goto switchD_002b7f3a_caseD_2;
    FormatString<char[56]>
              (&local_38,(char (*) [56])"BindingMode must be HIT_GROUP_BINDING_MODE_USER_DEFINED");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"CalculateHitGroupIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0x17a);
    goto LAB_002b7eff;
  }
  uVar1 = *InstanceOffset;
  Desc->ContributionToHitGroupIndex = uVar1;
  switch(BindingMode) {
  case HIT_GROUP_BINDING_MODE_PER_GEOMETRY:
    HitGroupStride =
         HitGroupStride *
         (((Desc->pBLAS).m_pObject)->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
         m_GeometryCount;
  case HIT_GROUP_BINDING_MODE_PER_INSTANCE:
    *InstanceOffset = uVar1 + HitGroupStride;
    goto LAB_002b7f4b;
  case HIT_GROUP_BINDING_MODE_PER_TLAS:
    goto switchD_002b7f3a_caseD_2;
  case HIT_GROUP_BINDING_MODE_LAST:
    FormatString<char[85]>
              (&local_38,
               (char (*) [85])
               "TLAS_INSTANCE_OFFSET_AUTO is not compatible with HIT_GROUP_BINDING_MODE_USER_DEFINED"
              );
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"CalculateHitGroupIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0x173);
    break;
  default:
    FormatString<char[40]>(&local_38,(char (*) [40])"Unknown ray tracing shader binding mode");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"CalculateHitGroupIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0x174);
  }
LAB_002b7eff:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
LAB_002b7f4b:
  uVar1 = Desc->ContributionToHitGroupIndex;
switchD_002b7f3a_caseD_2:
  local_14[0] = '\0';
  local_14[1] = '\0';
  local_14[2] = '\0';
  local_14[3] = '\x01';
  if (0xffffff < uVar1) {
    FormatString<char[47],unsigned_int>
              (&local_38,(Diligent *)"ContributionToHitGroupIndex must be less than ",
               (char (*) [47])local_14,(uint *)0x1000000);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"CalculateHitGroupIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0x17e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

static void CalculateHitGroupIndex(InstanceDesc& Desc, Uint32& InstanceOffset, const Uint32 HitGroupStride, const HIT_GROUP_BINDING_MODE BindingMode)
    {
        static_assert(HIT_GROUP_BINDING_MODE_LAST == HIT_GROUP_BINDING_MODE_USER_DEFINED, "Please update the switch below to handle the new shader binding mode");

        if (Desc.ContributionToHitGroupIndex == TLAS_INSTANCE_OFFSET_AUTO)
        {
            Desc.ContributionToHitGroupIndex = InstanceOffset;
            switch (BindingMode)
            {
                // clang-format off
                case HIT_GROUP_BINDING_MODE_PER_GEOMETRY:     InstanceOffset += Desc.pBLAS->GetActualGeometryCount() * HitGroupStride;                            break;
                case HIT_GROUP_BINDING_MODE_PER_INSTANCE:     InstanceOffset += HitGroupStride;                                                                   break;
                case HIT_GROUP_BINDING_MODE_PER_TLAS:         /* InstanceOffset is constant */                                                                  break;
                case HIT_GROUP_BINDING_MODE_USER_DEFINED:     UNEXPECTED("TLAS_INSTANCE_OFFSET_AUTO is not compatible with HIT_GROUP_BINDING_MODE_USER_DEFINED"); break;
                default:                                      UNEXPECTED("Unknown ray tracing shader binding mode");
                    // clang-format on
            }
        }
        else
        {
            VERIFY(BindingMode == HIT_GROUP_BINDING_MODE_USER_DEFINED, "BindingMode must be HIT_GROUP_BINDING_MODE_USER_DEFINED");
        }

        constexpr Uint32 MaxIndex = (1u << 24);
        VERIFY(Desc.ContributionToHitGroupIndex < MaxIndex, "ContributionToHitGroupIndex must be less than ", MaxIndex);
    }